

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::TParseContext::transparentOpaqueCheck
          (TParseContext *this,TSourceLoc *loc,TType *type,TString *identifier)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar4;
  TString *identifier_local;
  TType *type_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  
  if (((((this->super_TParseContextBase).parsingBuiltins & 1U) == 0) &&
      (iVar2 = (*type->_vptr_TType[0xb])(),
      ((uint)*(undefined8 *)(CONCAT44(extraout_var,iVar2) + 8) & 0x7f) == 5)) &&
     (uVar3 = (*type->_vptr_TType[0x39])(), (uVar3 & 1) != 0)) {
    if ((0 < (this->super_TParseContextBase).super_TParseVersions.spvVersion.vulkan) &&
       (((this->super_TParseContextBase).super_TParseVersions.spvVersion.vulkanRelaxed & 1U) == 0))
    {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x29])
                (this,loc,"non-opaque uniforms outside a block");
    }
    if (0 < (this->super_TParseContextBase).super_TParseVersions.spvVersion.openGl) {
      iVar2 = (*type->_vptr_TType[0xb])();
      bVar1 = TQualifier::hasLocation((TQualifier *)CONCAT44(extraout_var_00,iVar2));
      if ((!bVar1) &&
         (bVar1 = TIntermediate::getAutoMapLocations
                            ((this->super_TParseContextBase).super_TParseVersions.intermediate),
         !bVar1)) {
        pcVar4 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                           (identifier);
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"non-opaque uniform variables need a layout(location=L)",pcVar4,"");
      }
    }
  }
  return;
}

Assistant:

void TParseContext::transparentOpaqueCheck(const TSourceLoc& loc, const TType& type, const TString& identifier)
{
    if (parsingBuiltins)
        return;

    if (type.getQualifier().storage != EvqUniform)
        return;

    if (type.containsNonOpaque()) {
        // Vulkan doesn't allow transparent uniforms outside of blocks
        if (spvVersion.vulkan > 0 && !spvVersion.vulkanRelaxed)
            vulkanRemoved(loc, "non-opaque uniforms outside a block");
        // OpenGL wants locations on these (unless they are getting automapped)
        if (spvVersion.openGl > 0 && !type.getQualifier().hasLocation() && !intermediate.getAutoMapLocations())
            error(loc, "non-opaque uniform variables need a layout(location=L)", identifier.c_str(), "");
    }
}